

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::addRet(Analyser *this)

{
  Instruction local_40;
  Instruction local_30;
  Instruction local_20;
  Analyser *local_10;
  Analyser *this_local;
  
  local_10 = this;
  if (this->_currentFunctionRetType == 'i') {
    Instruction::Instruction(&local_20,ipush,0);
    addInstruction(this,&local_20);
    Instruction::Instruction(&local_30,iret);
    addInstruction(this,&local_30);
  }
  else {
    Instruction::Instruction(&local_40,ret);
    addInstruction(this,&local_40);
  }
  return;
}

Assistant:

void Analyser::addRet()
{
	//������
	if (_currentFunctionRetType == 'i') {
		addInstruction(Instruction(Operation::ipush, 0));
		addInstruction(Instruction(Operation::iret));
	}
	else {
		addInstruction(Instruction(Operation::ret));
	}
}